

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<long_double,unsigned_long>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,longdouble *t_lhs,longdouble *c_lhs,
          unsigned_long *c_rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *puVar2;
  arithmetic_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool b;
  longdouble lVar4;
  longdouble lVar5;
  Boxed_Value BVar6;
  string local_c8 [2];
  unsigned_long local_78;
  unsigned_long local_70;
  unsigned_long local_68;
  unsigned_long local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  unsigned_long local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  unsigned_long local_30;
  
  switch(t_oper) {
  case equals:
    local_78 = *c_rhs;
    b = (longdouble)(long)local_78 +
        (longdouble)*(float *)(&DAT_003840c8 + (ulong)((long)local_78 < 0) * 4) == *c_lhs;
    break;
  case less_than:
    lVar4 = *c_lhs;
    local_70 = *c_rhs;
    lVar5 = (longdouble)(long)local_70 +
            (longdouble)*(float *)(&DAT_003840c8 + (ulong)((long)local_70 < 0) * 4);
    goto LAB_00328137;
  case greater_than:
    lVar5 = *c_lhs;
    local_68 = *c_rhs;
    lVar4 = (longdouble)(long)local_68 +
            (longdouble)*(float *)(&DAT_003840c8 + (ulong)((long)local_68 < 0) * 4);
LAB_00328137:
    b = lVar4 < lVar5;
    break;
  case less_than_equal:
    lVar4 = *c_lhs;
    local_60 = *c_rhs;
    lVar5 = (longdouble)(long)local_60 +
            (longdouble)*(float *)(&DAT_003840c8 + (ulong)((long)local_60 < 0) * 4);
    goto LAB_003280da;
  case greater_than_equal:
    lVar5 = *c_lhs;
    local_58 = *c_rhs;
    lVar4 = (longdouble)(long)local_58 +
            (longdouble)*(float *)(&DAT_003840c8 + (ulong)((long)local_58 < 0) * 4);
LAB_003280da:
    b = lVar4 <= lVar5;
    break;
  case not_equal:
    local_50 = *c_rhs;
    b = (longdouble)(long)local_50 +
        (longdouble)*(float *)(&DAT_003840c8 + (ulong)((long)local_50 < 0) * 4) != *c_lhs;
    break;
  default:
    switch(t_oper) {
    case sum:
      local_48 = *c_rhs;
      lVar5 = (longdouble)(long)local_48 +
              (longdouble)*(float *)(&DAT_003840c8 + (ulong)((long)local_48 < 0) * 4) + *c_lhs;
      break;
    case quotient:
      local_40 = *c_rhs;
      if (local_40 == 0) {
        this_00 = (arithmetic_error *)__cxa_allocate_exception(0x10);
        local_c8[0]._M_dataplus._M_p = (pointer)&local_c8[0].field_2;
        local_c8[0].field_2._M_allocated_capacity._0_6_ = 0x656469766964;
        local_c8[0].field_2._M_allocated_capacity._6_2_ = 0x6220;
        local_c8[0].field_2._8_6_ = 0x6f72657a2079;
        local_c8[0]._M_string_length._0_2_ = 0xe;
        local_c8[0]._M_string_length._2_6_ = 0;
        local_c8[0].field_2._M_local_buf[0xe] = '\0';
        exception::arithmetic_error::arithmetic_error(this_00,local_c8);
        __cxa_throw(this_00,&exception::arithmetic_error::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      lVar5 = *c_lhs / ((longdouble)(long)local_40 +
                       (longdouble)*(float *)(&DAT_003840c8 + (ulong)((long)local_40 < 0) * 4));
      break;
    case product:
      local_38 = *c_rhs;
      lVar5 = ((longdouble)(long)local_38 +
              (longdouble)*(float *)(&DAT_003840c8 + (ulong)((long)local_38 < 0) * 4)) * *c_lhs;
      break;
    case difference:
      local_30 = *c_rhs;
      lVar5 = *c_lhs - ((longdouble)(long)local_30 +
                       (longdouble)*(float *)(&DAT_003840c8 + (ulong)((long)local_30 < 0) * 4));
      break;
    default:
      if (t_lhs == (longdouble *)0x0) {
switchD_00328036_caseD_7:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = &PTR__bad_cast_003fbde8;
        __cxa_throw(puVar2,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_bv;
      switch(t_oper) {
      case assign:
        lVar5 = (longdouble)(long)*c_rhs +
                (longdouble)*(float *)(&DAT_003840c8 + (ulong)((long)*c_rhs < 0) * 4);
        break;
      default:
        goto switchD_00328036_caseD_7;
      case assign_product:
        lVar5 = *t_lhs * ((longdouble)(long)*c_rhs +
                         (longdouble)*(float *)(&DAT_003840c8 + (ulong)((long)*c_rhs < 0) * 4));
        break;
      case assign_sum:
        lVar5 = *t_lhs + (longdouble)(long)*c_rhs +
                         (longdouble)*(float *)(&DAT_003840c8 + (ulong)((long)*c_rhs < 0) * 4);
        break;
      case assign_quotient:
        check_divide_by_zero<unsigned_long>(*c_rhs);
        lVar5 = *t_lhs / ((longdouble)(long)*c_rhs +
                         (longdouble)*(float *)(&DAT_003840c8 + (ulong)((long)*c_rhs < 0) * 4));
        _Var3._M_pi = extraout_RDX;
        break;
      case assign_difference:
        lVar5 = *t_lhs - ((longdouble)(long)*c_rhs +
                         (longdouble)*(float *)(&DAT_003840c8 + (ulong)((long)*c_rhs < 0) * 4));
      }
      *t_lhs = lVar5;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (t_bv->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var1 = (t_bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var1;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      goto LAB_003281bb;
    }
    local_c8[0]._M_dataplus._M_p = SUB108(lVar5,0);
    local_c8[0]._M_string_length._0_2_ = (undefined2)((unkuint10)lVar5 >> 0x40);
    BVar6 = detail::const_var_impl<long_double>((detail *)this,(longdouble *)local_c8);
    _Var3._M_pi = BVar6.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_003281bb;
  }
  BVar6 = const_var((chaiscript *)this,b);
  _Var3._M_pi = BVar6.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_003281bb:
  BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }